

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O3

void obuf_destroy(obuf *buf)

{
  iovec *piVar1;
  long lVar2;
  
  if (0 < buf->n_iov) {
    piVar1 = buf->iov;
    lVar2 = 0;
    do {
      slab_put(buf->slabc,(slab *)((long)piVar1->iov_base + -0x30));
      lVar2 = lVar2 + 1;
      piVar1 = piVar1 + 1;
    } while (lVar2 < buf->n_iov);
  }
  memset(buf,0,0x328);
  return;
}

Assistant:

void
obuf_destroy(struct obuf *buf)
{
	int i;
	for (i = 0; i < buf->n_iov; i++) {
		struct slab *slab = slab_from_data(buf->iov[i].iov_base);
		slab_put(buf->slabc, slab);
	}
	/* Safety and also makes obuf_is_initialized work. */
	memset(buf, 0, sizeof(*buf));
}